

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::SetActiveDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,ActiveOperationalDataset *aDataset)

{
  bool bVar1;
  element_type *peVar2;
  Error *aError;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_21;
  ActiveOperationalDataset *local_20;
  ActiveOperationalDataset *aDataset_local;
  CommissionerApp *this_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aDataset;
  aDataset_local = (ActiveOperationalDataset *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x1e])(&local_50,peVar2,local_20);
  aError = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_60);
  Error::~Error(&local_50);
  if (!bVar1) {
    MergeDataset(&this->mActiveDataset,local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::SetActiveDataset(const ActiveOperationalDataset &aDataset)
{
    Error error;

    SuccessOrExit(error = mCommissioner->SetActiveDataset(aDataset));
    MergeDataset(mActiveDataset, aDataset);

exit:
    return error;
}